

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  ulong uVar4;
  char *pcVar5;
  uint32_t sz;
  byte *pbVar6;
  
  pbVar6 = (byte *)(ctx->sb).w;
  if ((uint)(*(int *)&(ctx->sb).e - (int)pbVar6) < 0xb) {
    pbVar6 = (byte *)lj_buf_more2(&ctx->sb,0xb);
  }
  uVar4 = o->it64 >> 0x2f;
  if (uVar4 == 0xfffffffffffffffb) {
    uVar4 = o->it64 & 0x7fffffffffff;
    uVar2 = *(uint *)(uVar4 + 0x14);
    sz = uVar2 + 5;
    pcVar5 = (ctx->sb).w;
    if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar5) < sz) {
      pcVar5 = lj_buf_more2(&ctx->sb,sz);
    }
    pcVar5 = lj_strfmt_wuleb128(pcVar5,sz);
    memcpy(pcVar5,(void *)(uVar4 + 0x18),(ulong)uVar2);
    pbVar6 = (byte *)(pcVar5 + uVar2);
  }
  else if (uVar4 < 0xfffffffffffffff2) {
    if (narrow != 0) {
      dVar1 = o->n;
      dVar3 = (double)(int)dVar1;
      if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) {
        *pbVar6 = 3;
        pbVar6 = (byte *)lj_strfmt_wuleb128((char *)(pbVar6 + 1),(int)dVar1);
        (ctx->sb).w = (char *)pbVar6;
      }
      if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) {
        return;
      }
    }
    *pbVar6 = 4;
    pcVar5 = lj_strfmt_wuleb128((char *)(pbVar6 + 1),(o->u32).lo);
    pbVar6 = (byte *)lj_strfmt_wuleb128(pcVar5,(o->field_4).it);
  }
  else {
    *pbVar6 = ~(byte)uVar4;
    pbVar6 = pbVar6 + 1;
  }
  (ctx->sb).w = (char *)pbVar6;
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  char *p = lj_buf_more(&ctx->sb, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    p = lj_buf_more(&ctx->sb, 5+len);
    p = lj_strfmt_wuleb128(p, BCDUMP_KTAB_STR+len);
    p = lj_buf_wmem(p, strdata(str), len);
  } else if (tvisint(o)) {
    *p++ = BCDUMP_KTAB_INT;
    p = lj_strfmt_wuleb128(p, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	*p++ = BCDUMP_KTAB_INT;
	p = lj_strfmt_wuleb128(p, k);
	ctx->sb.w = p;
	return;
      }
    }
    *p++ = BCDUMP_KTAB_NUM;
    p = lj_strfmt_wuleb128(p, o->u32.lo);
    p = lj_strfmt_wuleb128(p, o->u32.hi);
  } else {
    lj_assertBCW(tvispri(o), "unhandled type %d", itype(o));
    *p++ = BCDUMP_KTAB_NIL+~itype(o);
  }
  ctx->sb.w = p;
}